

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O1

void nn_req_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  nn_queue_item *pnVar1;
  
  pnVar1 = &self[-10].stopped.item;
  if (self == (nn_fsm *)0x0) {
    pnVar1 = (nn_queue_item *)0x0;
  }
  if (type == -3 && src == -2) goto LAB_001245b3;
  while (*(int *)(pnVar1 + 0x6f) != 9) {
    nn_req_shutdown_cold_1();
LAB_001245b3:
    nn_timer_stop((nn_timer *)(pnVar1 + 0x8a));
    *(undefined4 *)(pnVar1 + 0x6f) = 9;
  }
  nn_req_shutdown_cold_2();
  return;
}

Assistant:

void nn_req_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_req *req;

    req = nn_cont (self, struct nn_req, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        nn_timer_stop (&req->task.timer);
        req->state = NN_REQ_STATE_STOPPING;
    }
    if (nn_slow (req->state == NN_REQ_STATE_STOPPING)) {
        if (!nn_timer_isidle (&req->task.timer))
            return;
        req->state = NN_REQ_STATE_IDLE;
        nn_fsm_stopped_noevent (&req->fsm);
        nn_sockbase_stopped (&req->xreq.sockbase);
        return;
    }

    nn_fsm_bad_state(req->state, src, type);
}